

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

void CMakeCommandUsage(char *program)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream errorStream;
  char *local_1a8 [4];
  ostream local_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  poVar1 = std::operator<<(&local_188,"cmake version ");
  pcVar2 = cmVersion::GetCMakeVersion();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(&local_188,"Usage: ");
  poVar1 = std::operator<<(poVar1,program);
  poVar1 = std::operator<<(poVar1," -E [command] [arguments ...]\n");
  poVar1 = std::operator<<(poVar1,"Available commands: \n");
  poVar1 = std::operator<<(poVar1,"  chdir dir cmd [args]...   - run command in a given directory\n"
                          );
  poVar1 = std::operator<<(poVar1,"  compare_files file1 file2 - check if file1 is same as file2\n")
  ;
  poVar1 = std::operator<<(poVar1,
                           "  copy file destination     - copy file to destination (either file or directory)\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  copy_directory source destination   - copy directory \'source\' content to directory \'destination\'\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  copy_if_different in-file out-file  - copy file if input has changed\n"
                          );
  poVar1 = std::operator<<(poVar1,"  echo [string]...          - displays arguments as text\n");
  poVar1 = std::operator<<(poVar1,
                           "  echo_append [string]...   - displays arguments as text but no new line\n"
                          );
  poVar1 = std::operator<<(poVar1,"  env [--unset=NAME]... [NAME=VALUE]... COMMAND [ARG]...\n");
  poVar1 = std::operator<<(poVar1,
                           "                            - run command in a modified environment\n");
  poVar1 = std::operator<<(poVar1,"  environment               - display the current environment\n")
  ;
  poVar1 = std::operator<<(poVar1,"  make_directory dir        - create a directory\n");
  poVar1 = std::operator<<(poVar1,"  md5sum file1 [...]        - compute md5sum of files\n");
  poVar1 = std::operator<<(poVar1,
                           "  remove [-f] file1 file2 ... - remove the file(s), use -f to force it\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "  remove_directory dir      - remove a directory and its contents\n");
  poVar1 = std::operator<<(poVar1,
                           "  rename oldname newname    - rename a file or directory (on one volume)\n"
                          );
  poVar1 = std::operator<<(poVar1,"  tar [cxt][vf][zjJ] file.tar [file/dir1 file/dir2 ...]\n");
  poVar1 = std::operator<<(poVar1,
                           "                            - create or extract a tar or zip archive\n")
  ;
  poVar1 = std::operator<<(poVar1,
                           "  sleep <number>...         - sleep for given number of seconds\n");
  poVar1 = std::operator<<(poVar1,
                           "  time command [args] ...   - run command and return elapsed time\n");
  poVar1 = std::operator<<(poVar1,"  touch file                - touch a file.\n");
  poVar1 = std::operator<<(poVar1,
                           "  touch_nocreate file       - touch a file but do not create it.\n");
  poVar1 = std::operator<<(poVar1,"Available on UNIX only:\n");
  std::operator<<(poVar1,"  create_symlink old new    - create a symbolic link new -> old\n");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(local_1a8[0],(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return;
}

Assistant:

void CMakeCommandUsage(const char* program)
{
  std::ostringstream errorStream;

#ifdef CMAKE_BUILD_WITH_CMAKE
  errorStream
    << "cmake version " << cmVersion::GetCMakeVersion() << "\n";
#else
  errorStream
    << "cmake bootstrap\n";
#endif
  // If you add new commands, change here,
  // and in cmakemain.cxx in the options table
  errorStream
    << "Usage: " << program << " -E [command] [arguments ...]\n"
    << "Available commands: \n"
    << "  chdir dir cmd [args]...   - run command in a given directory\n"
    << "  compare_files file1 file2 - check if file1 is same as file2\n"
    << "  copy file destination     - copy file to destination (either file "
       "or directory)\n"
    << "  copy_directory source destination   - copy directory 'source' "
       "content to directory 'destination'\n"
    << "  copy_if_different in-file out-file  - copy file if input has "
       "changed\n"
    << "  echo [string]...          - displays arguments as text\n"
    << "  echo_append [string]...   - displays arguments as text but no new "
       "line\n"
    << "  env [--unset=NAME]... [NAME=VALUE]... COMMAND [ARG]...\n"
    << "                            - run command in a modified environment\n"
    << "  environment               - display the current environment\n"
    << "  make_directory dir        - create a directory\n"
    << "  md5sum file1 [...]        - compute md5sum of files\n"
    << "  remove [-f] file1 file2 ... - remove the file(s), use -f to force "
       "it\n"
    << "  remove_directory dir      - remove a directory and its contents\n"
    << "  rename oldname newname    - rename a file or directory "
       "(on one volume)\n"
    << "  tar [cxt][vf][zjJ] file.tar [file/dir1 file/dir2 ...]\n"
    << "                            - create or extract a tar or zip archive\n"
    << "  sleep <number>...         - sleep for given number of seconds\n"
    << "  time command [args] ...   - run command and return elapsed time\n"
    << "  touch file                - touch a file.\n"
    << "  touch_nocreate file       - touch a file but do not create it.\n"
#if defined(_WIN32) && !defined(__CYGWIN__)
    << "Available on Windows only:\n"
    << "  delete_regv key           - delete registry value\n"
    << "  env_vs8_wince sdkname     - displays a batch file which sets the "
       "environment for the provided Windows CE SDK installed in VS2005\n"
    << "  env_vs9_wince sdkname     - displays a batch file which sets the "
       "environment for the provided Windows CE SDK installed in VS2008\n"
    << "  write_regv key value      - write registry value\n"
#else
    << "Available on UNIX only:\n"
    << "  create_symlink old new    - create a symbolic link new -> old\n"
#endif
    ;

  cmSystemTools::Error(errorStream.str().c_str());
}